

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTexture2DR(GatherBase *this,bool base_level)

{
  GLenum type;
  GLenum width;
  reference pixels_00;
  undefined8 uStack_78;
  GLfloat data [4];
  allocator<float> local_4d;
  value_type_conflict2 local_4c;
  undefined1 local_48 [8];
  vector<float,_std::allocator<float>_> pixels;
  int i;
  GLenum tex_type;
  GLenum target;
  GLint size;
  GLint csize;
  GLenum format;
  GLenum internal_format;
  bool base_level_local;
  GatherBase *this_local;
  
  width = 0x20;
  if (base_level) {
    width = 0x40;
  }
  pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x1406;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             this->tex);
  pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  for (tex_type = width; 0 < (int)tex_type; tex_type = (int)tex_type / 2) {
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               (int)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,0x822e,tex_type,tex_type,0,0x1903,
               pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,(void *)0x0);
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1;
  }
  local_4c = 1.0;
  std::allocator<float>::allocator(&local_4d);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_48,(long)(int)(width * width),&local_4c,
             &local_4d);
  std::allocator<float>::~allocator(&local_4d);
  type = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
  pixels_00 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_48,0);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,0,0,
             0,width,width,0x1903,type,pixels_00);
  glu::CallLogWrapper::glGenerateMipmap
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1);
  uStack_78 = 0x3f0000003f400000;
  data[0] = 0.0;
  data[1] = 0.25;
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             base_level & 1,0x16,0x19,2,2,0x1903,
             pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,&uStack_78);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             base_level & 1,0x10,10,1,1,0x1903,
             pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,&uStack_78);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             base_level & 1,0xb,2,1,1,0x1903,
             pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,(void *)((long)&uStack_78 + 4));
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             base_level & 1,0x18,0xd,1,1,0x1903,
             pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,data);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             base_level & 1,9,0xe,1,1,0x1903,
             pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,data + 1);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x8072,0x812f);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_48);
  return;
}

Assistant:

virtual GLvoid CreateTexture2DR(bool base_level = false)
	{
		GLenum		internal_format = GL_R32F;
		GLenum		format			= GL_RED;
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, 0);
		}
		std::vector<GLfloat> pixels(csize * csize, 1.0);
		glTexSubImage2D(target, 0, 0, 0, csize, csize, format, tex_type, &pixels[0]);
		glGenerateMipmap(target);

		GLfloat data[4] = { 12. / 16., 8. / 16., 0. / 16., 4. / 16. };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	}